

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp_comparison.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  
  *(undefined8 *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) = 0x1e;
  poVar1 = std::ostream::_M_insert<double>(5.699999809265137);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"is not equal to ");
  poVar1 = std::ostream::_M_insert<double>(5.7);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main()
{
    float num = 5.7f;
    std::cout << std::setprecision(30) << num << std::endl;

    if (isEqual(num, 5.7))
        std::cout << "is equal to " << 5.7 << std::endl;
    else
        std::cout << "is not equal to " << 5.7 << std::endl;

    return 0;
}